

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::MultiFileReader::GetConstantVirtualColumn
          (MultiFileReader *this,MultiFileReaderData *reader_data,idx_t column_id,LogicalType *type)

{
  BoundConstantExpression *this_00;
  LogicalType *in_R8;
  LogicalType local_b0;
  Value local_98;
  Value local_58;
  
  if (type == (LogicalType *)0xfffffffffffffffe) {
    LogicalType::LogicalType(&local_b0,in_R8);
    Value::Value(&local_98,&local_b0);
    this_00 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_58,&local_98);
    BoundConstantExpression::BoundConstantExpression(this_00,&local_58);
    Value::~Value(&local_58);
    this->_vptr_MultiFileReader = (_func_int **)this_00;
    Value::~Value(&local_98);
    LogicalType::~LogicalType(&local_b0);
  }
  else {
    this->_vptr_MultiFileReader = (_func_int **)0x0;
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> MultiFileReader::GetConstantVirtualColumn(MultiFileReaderData &reader_data, idx_t column_id,
                                                                 const LogicalType &type) {
	if (column_id == COLUMN_IDENTIFIER_EMPTY || column_id == COLUMN_IDENTIFIER_FILENAME) {
		return make_uniq<BoundConstantExpression>(Value(type));
	}
	return nullptr;
}